

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXImporter.cpp
# Opt level: O0

void __thiscall Assimp::FBXImporter::FBXImporter(FBXImporter *this)

{
  FBXImporter *this_local;
  
  BaseImporter::BaseImporter(&this->super_BaseImporter);
  (this->super_BaseImporter)._vptr_BaseImporter = (_func_int **)&PTR_UpdateImporterScale_00fa7bf0;
  FBX::ImportSettings::ImportSettings(&this->settings);
  return;
}

Assistant:

FBXImporter::FBXImporter()
{
}